

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qtimezoneprivate.cpp
# Opt level: O0

QByteArray * QTimeZonePrivate::ianaIdToWindowsId(QByteArray *id)

{
  bool bVar1;
  iterator *in_RDI;
  long in_FS_OFFSET;
  TokenizerResult<const_QLatin1String_&,_char16_t> *__range2;
  ZoneData *data;
  ZoneData *__end1;
  ZoneData *__begin1;
  ZoneData (*__range1) [361];
  QLatin1String l1;
  sentinel __end2;
  iterator __begin2;
  QUtf8StringView idUtf8;
  iterator *this;
  QByteArray *in_stack_ffffffffffffff38;
  QBasicUtf8StringView<false> *in_stack_ffffffffffffff40;
  QStringTokenizerBase<QLatin1String,_QChar> *this_00;
  undefined2 *local_a8;
  undefined1 uVar2;
  quint16 in_stack_ffffffffffffff8e;
  undefined1 local_70 [56];
  undefined1 *local_38;
  undefined1 *local_30;
  QStringTokenizerBase<QLatin1String,_QChar> local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  local_38 = &DAT_aaaaaaaaaaaaaaaa;
  local_30 = &DAT_aaaaaaaaaaaaaaaa;
  this = in_RDI;
  QBasicUtf8StringView<false>::QBasicUtf8StringView<QByteArray,_true>
            (in_stack_ffffffffffffff40,in_stack_ffffffffffffff38);
  local_a8 = &QtTimeZoneCldr::zoneDataTable;
  do {
    uVar2 = (undefined1)in_stack_ffffffffffffff8e;
    if (local_a8 == (undefined2 *)&DAT_00a05816) {
      QByteArray::QByteArray((QByteArray *)0x73b2d4);
LAB_0073b2d4:
      if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
        return (QByteArray *)this;
      }
      __stack_chk_fail();
    }
    QtTimeZoneCldr::ZoneData::ids((ZoneData *)this);
    this_00 = &local_28;
    memset(local_70,0xaa,0x38);
    QStringTokenizerBase<QLatin1String,_QChar>::begin
              ((QStringTokenizerBase<QLatin1String,_QChar> *)this);
    in_stack_ffffffffffffff8e = CONCAT11(0xaa,uVar2);
    QStringTokenizerBase<QLatin1String,_QChar>::end(this_00);
    while( true ) {
      bVar1 = ::operator!=(local_70);
      if (!bVar1) break;
      QStringTokenizerBase<QLatin1String,_QChar>::iterator::operator*((iterator *)0x73b26c);
      bVar1 = ::operator==((QLatin1StringView *)this,(QBasicUtf8StringView<false> *)in_RDI);
      if (bVar1) {
        toWindowsIdLiteral(in_stack_ffffffffffffff8e);
        goto LAB_0073b2d4;
      }
      QStringTokenizerBase<QLatin1String,_QChar>::iterator::operator++(this);
    }
    local_a8 = local_a8 + 3;
  } while( true );
}

Assistant:

QByteArray QTimeZonePrivate::ianaIdToWindowsId(const QByteArray &id)
{
    const auto idUtf8 = QUtf8StringView(id);

    for (const ZoneData &data : zoneDataTable) {
        for (auto l1 : data.ids()) {
            if (l1 == idUtf8)
                return toWindowsIdLiteral(data.windowsIdKey);
        }
    }
    // If the IANA ID is the default for any Windows ID, it has already shown up
    // as an ID for it in some territory; no need to search windowsDataTable[].
    return QByteArray();
}